

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

string * __thiscall
cmCTestSVN::SVNInfo::BuildLocalPath(string *__return_storage_ptr__,SVNInfo *this,string *path)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s1;
  char *__s2;
  size_t __n;
  string local_58 [55];
  undefined1 local_21;
  string *local_20;
  string *path_local;
  SVNInfo *this_local;
  string *local_path;
  
  local_21 = 0;
  local_20 = path;
  path_local = &this->LocalPath;
  this_local = (SVNInfo *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  uVar3 = std::__cxx11::string::size();
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < uVar3) {
    __s1 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    iVar2 = strncmp(__s1,__s2,__n);
    psVar1 = local_20;
    if (iVar2 == 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_58,(ulong)psVar1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string(local_58);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSVN::SVNInfo::BuildLocalPath(std::string const& path) const
{
  std::string local_path;

  // Add local path prefix if not empty
  if (!this->LocalPath.empty()) {
    local_path += this->LocalPath;
    local_path += "/";
  }

  // Add path with base prefix removed
  if (path.size() > this->Base.size() &&
      strncmp(path.c_str(), this->Base.c_str(), this->Base.size()) == 0) {
    local_path += path.substr(this->Base.size());
  } else {
    local_path += path;
  }

  return local_path;
}